

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfRelocator.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
MipsElfRelocator::generateCtorStub
          (MipsElfRelocator *this,vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_> *ctors
          )

{
  char *args;
  long *in_RDX;
  long lVar1;
  long *plVar2;
  ulong uVar3;
  undefined1 auVar4 [8];
  unsigned_long *in_R9;
  initializer_list<AssemblyTemplateArgument> variables;
  initializer_list<AssemblyTemplateArgument> variables_00;
  string table;
  Parser parser;
  allocator<char> local_259;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  long local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Head_base<0UL,_CAssemblerCommand_*,_false> local_238;
  Identifier local_230;
  Identifier local_210;
  Identifier local_1f0;
  undefined1 local_1d0 [32];
  undefined1 local_1b0 [8];
  char *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  char *local_188;
  string local_180;
  char *local_160;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  char *local_138;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  char *local_110;
  long *local_108 [2];
  long local_f8 [2];
  unsigned_long local_e8;
  undefined1 local_e0 [24];
  _Rb_tree<Identifier,_std::pair<const_Identifier,_ParserMacro>,_std::_Select1st<std::pair<const_Identifier,_ParserMacro>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
  local_c8;
  _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
  local_98;
  pointer local_48;
  pointer local_38;
  
  Parser::Parser((Parser *)local_e0);
  if (in_RDX[1] == *in_RDX) {
    local_1b0 = (undefined1  [8])&local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"jr ra :: nop","");
    variables_00._M_len = 0;
    variables_00._M_array = (iterator)local_1b0;
    Parser::parseTemplate((Parser *)this,(string *)local_e0,variables_00);
    auVar4 = local_1b0;
    if (local_1b0 == (undefined1  [8])&local_1a0) goto LAB_001666cf;
  }
  else {
    local_258 = &local_248;
    local_250 = 0;
    local_248._M_local_buf[0] = '\0';
    local_238._M_head_impl = (CAssemblerCommand *)this;
    if (in_RDX[1] != *in_RDX) {
      lVar1 = 0x20;
      uVar3 = 0;
      do {
        if (uVar3 != 0) {
          std::__cxx11::string::push_back((char)&local_258);
        }
        args = (char *)(*in_RDX + lVar1 + -0x20);
        tinyformat::format<Identifier,Identifier,unsigned_long>
                  ((string *)local_1b0,(tinyformat *)"%s,%s+0x%08X",args,(Identifier *)args,
                   (Identifier *)(*in_RDX + lVar1),in_R9);
        std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1b0);
        if (local_1b0 != (undefined1  [8])&local_1a0) {
          operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
        }
        uVar3 = uVar3 + 1;
        lVar1 = lVar1 + 0x28;
      } while (uVar3 < (ulong)((in_RDX[1] - *in_RDX >> 3) * -0x3333333333333333));
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1d0,mipsCtorTemplate,&local_259);
    local_1b0 = (undefined1  [8])0x18fd08;
    SymbolTable::getUniqueLabelName(&local_1f0,&Global.symbolTable,false);
    local_1a8 = local_1a0._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,local_1f0._name._M_dataplus._M_p,
               local_1f0._name._M_dataplus._M_p + local_1f0._name._M_string_length);
    local_188 = "%ctorTableSize%";
    local_e8 = ((ulong)(in_RDX[1] - *in_RDX) >> 3) * 0x6666666666666668;
    tinyformat::format<unsigned_long>(&local_180,"%d",&local_e8);
    local_160 = "%outerLoopLabel%";
    SymbolTable::getUniqueLabelName(&local_210,&Global.symbolTable,false);
    local_158[0] = local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_158,local_210._name._M_dataplus._M_p,
               local_210._name._M_dataplus._M_p + local_210._name._M_string_length);
    local_138 = "%innerLoopLabel%";
    SymbolTable::getUniqueLabelName(&local_230,&Global.symbolTable,false);
    local_130[0] = local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_130,local_230._name._M_dataplus._M_p,
               local_230._name._M_dataplus._M_p + local_230._name._M_string_length);
    this = (MipsElfRelocator *)local_238._M_head_impl;
    local_110 = "%ctorContent%";
    plVar2 = local_f8;
    local_108[0] = plVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_108,local_258,local_258->_M_local_buf + local_250);
    variables._M_len = (size_type)local_1b0;
    variables._M_array = (iterator)local_1d0;
    Parser::parseTemplate((Parser *)this,(string *)local_e0,variables);
    lVar1 = -200;
    do {
      if (plVar2 != (long *)plVar2[-2]) {
        operator_delete((long *)plVar2[-2],*plVar2 + 1);
      }
      plVar2 = plVar2 + -5;
      lVar1 = lVar1 + 0x28;
    } while (lVar1 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._name._M_dataplus._M_p != &local_230._name.field_2) {
      operator_delete(local_230._name._M_dataplus._M_p,
                      local_230._name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._name._M_dataplus._M_p != &local_210._name.field_2) {
      operator_delete(local_210._name._M_dataplus._M_p,
                      local_210._name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._name._M_dataplus._M_p != &local_1f0._name.field_2) {
      operator_delete(local_1f0._name._M_dataplus._M_p,
                      local_1f0._name.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    if (local_258 == &local_248) goto LAB_001666cf;
    local_1a0._M_allocated_capacity =
         CONCAT71(local_248._M_allocated_capacity._1_7_,local_248._M_local_buf[0]);
    auVar4 = (undefined1  [8])local_258;
  }
  operator_delete((void *)auVar4,local_1a0._M_allocated_capacity + 1);
LAB_001666cf:
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  std::
  _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
  ::~_Rb_tree(&local_98);
  std::
  _Rb_tree<Identifier,_std::pair<const_Identifier,_ParserMacro>,_std::_Select1st<std::pair<const_Identifier,_ParserMacro>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
  ::~_Rb_tree(&local_c8);
  if ((pointer)local_e0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ - local_e0._0_8_);
  }
  return (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>)
         (CAssemblerCommand *)this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> MipsElfRelocator::generateCtorStub(std::vector<ElfRelocatorCtor>& ctors)
{
	Parser parser;
	if (ctors.size() != 0)
	{
		// create constructor table
		std::string table;
		for (size_t i = 0; i < ctors.size(); i++)
		{
			if (i != 0)
				table += ',';
			table += tfm::format("%s,%s+0x%08X",ctors[i].symbolName,ctors[i].symbolName,ctors[i].size);
		}

		return parser.parseTemplate(mipsCtorTemplate,{
			{ "%ctorTable%",		Global.symbolTable.getUniqueLabelName().string() },
			{ "%ctorTableSize%",	tfm::format("%d",ctors.size()*8) },
			{ "%outerLoopLabel%",	Global.symbolTable.getUniqueLabelName().string() },
			{ "%innerLoopLabel%",	Global.symbolTable.getUniqueLabelName().string() },
			{ "%ctorContent%",		table },
		});
	} else {
		return parser.parseTemplate("jr ra :: nop");
	}
}